

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void initMakeData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  initializer_list<std::pair<char,_QLatin1String>_> list_02;
  QMultiHash<char,_QLatin1String> QStack_3e8;
  pair<char,_QLatin1String> local_3d8;
  undefined1 local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined1 local_3a8;
  undefined8 local_3a0;
  char *local_398;
  undefined1 local_390;
  undefined8 local_388;
  char *local_380;
  undefined1 local_378;
  undefined8 local_370;
  char *local_368;
  undefined1 local_360;
  undefined8 local_358;
  char *local_350;
  undefined1 local_348;
  undefined8 local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_328;
  char *local_320;
  undefined1 local_318;
  undefined8 local_310;
  char *local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  char *local_290;
  undefined1 local_288;
  undefined8 local_280;
  char *local_278;
  undefined1 local_270;
  undefined8 local_268;
  char *local_260;
  undefined1 local_258;
  undefined8 local_250;
  char *local_248;
  undefined1 local_240;
  undefined8 local_238;
  char *local_230;
  undefined1 local_228;
  undefined8 local_220;
  char *local_218;
  undefined1 local_210;
  undefined8 local_208;
  char *local_200;
  undefined1 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined8 local_190;
  char *local_188;
  undefined1 local_180;
  undefined8 local_178;
  char *local_170;
  undefined1 local_168;
  undefined8 local_160;
  char *local_158;
  undefined1 local_150;
  undefined8 local_148;
  char *local_140;
  undefined1 local_138;
  undefined8 local_130;
  char *local_128;
  undefined1 local_120;
  undefined8 local_118;
  char *local_110;
  undefined1 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78;
  undefined8 local_70;
  char *local_68;
  undefined1 local_60;
  undefined8 local_58;
  char *local_50;
  undefined1 local_48;
  undefined8 local_40;
  char *local_38;
  
  local_3d8.first = 'i';
  local_3d8.second.m_size = 7;
  local_3d8.second.m_data = "include";
  local_3c0 = 100;
  local_3b8 = 6;
  local_3b0 = "define";
  local_3a8 = 0x65;
  local_3a0 = 4;
  local_398 = "else";
  local_390 = 0x65;
  local_388 = 5;
  local_380 = "endef";
  local_378 = 0x65;
  local_370 = 5;
  local_368 = "endif";
  local_360 = 0x65;
  local_358 = 6;
  local_350 = "export";
  local_348 = 0x69;
  local_340 = 7;
  local_338 = "ifn?def";
  local_330 = 0x69;
  local_328 = 6;
  local_320 = "ifn?eq";
  local_318 = 0x69;
  local_310 = 7;
  local_308 = "include";
  local_300 = 0x6f;
  local_2f8 = 8;
  local_2f0 = "override";
  local_2e8 = 0x70;
  local_2e0 = 7;
  local_2d8 = "private";
  local_2d0 = 0x73;
  local_2c8 = 8;
  local_2c0 = "sinclude";
  local_2b8 = 0x75;
  local_2b0 = 8;
  local_2a8 = "undefine";
  local_2a0 = 0x75;
  local_298 = 8;
  local_290 = "unexport";
  local_288 = 0x76;
  local_280 = 5;
  local_278 = "vpath";
  list._M_len = 0xf;
  list._M_array = &local_3d8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_3e8,list);
  QMultiHash<char,_QLatin1String>::operator=(&make_keywords,&QStack_3e8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_3e8);
  local_3d8.first = 'a';
  local_3d8.second.m_size = 9;
  local_3d8.second.m_data = "addsuffix";
  local_3c0 = 0x61;
  local_3b8 = 7;
  local_3b0 = "abspath";
  local_3a8 = 0x61;
  local_3a0 = 3;
  local_398 = "and";
  local_390 = 0x61;
  local_388 = 2;
  local_380 = "ar";
  local_378 = 0x62;
  local_370 = 8;
  local_368 = "basename";
  local_360 = 99;
  local_358 = 4;
  local_350 = "call";
  local_348 = 100;
  local_340 = 3;
  local_338 = "dir";
  local_330 = 0x65;
  local_328 = 5;
  local_320 = "error";
  local_318 = 0x65;
  local_310 = 4;
  local_308 = "eval";
  local_300 = 0x66;
  local_2f8 = 4;
  local_2f0 = "file";
  local_2e8 = 0x66;
  local_2e0 = 6;
  local_2d8 = "filter";
  local_2d0 = 0x66;
  local_2c8 = 4;
  local_2c0 = "find";
  local_2b8 = 0x66;
  local_2b0 = 10;
  local_2a8 = "findstring";
  local_2a0 = 0x66;
  local_298 = 9;
  local_290 = "firstword";
  local_288 = 0x66;
  local_280 = 6;
  local_278 = "flavor";
  local_270 = 0x66;
  local_268 = 7;
  local_260 = "foreach";
  local_258 = 0x67;
  local_250 = 5;
  local_248 = "guile";
  local_240 = 0x69;
  local_238 = 2;
  local_230 = "if";
  local_228 = 0x69;
  local_220 = 4;
  local_218 = "info";
  local_210 = 0x69;
  local_208 = 7;
  local_200 = "install";
  local_1f8 = 0x6a;
  local_1f0 = 4;
  local_1e8 = "join";
  local_1e0 = 0x6c;
  local_1d8 = 8;
  local_1d0 = "lastword";
  local_1c8 = 0x6c;
  local_1c0 = 4;
  local_1b8 = "load";
  local_1b0 = 0x6e;
  local_1a8 = 6;
  local_1a0 = "notdir";
  local_198 = 0x6f;
  local_190 = 2;
  local_188 = "or";
  local_180 = 0x6f;
  local_178 = 6;
  local_170 = "origin";
  local_168 = 0x70;
  local_160 = 8;
  local_158 = "patsubst";
  local_150 = 0x72;
  local_148 = 6;
  local_140 = "ranlib";
  local_138 = 0x72;
  local_130 = 8;
  local_128 = "realpath";
  local_120 = 0x72;
  local_118 = 2;
  local_110 = "rm";
  local_108 = 0x73;
  local_100 = 5;
  local_f8 = "shell";
  local_f0 = 0x73;
  local_e8 = 4;
  local_e0 = "sort";
  local_d8 = 0x73;
  local_d0 = 5;
  local_c8 = "strip";
  local_c0 = 0x73;
  local_b8 = 5;
  local_b0 = "subst";
  local_a8 = 0x73;
  local_a0 = 6;
  local_98 = "suffix";
  local_90 = 0x76;
  local_88 = 5;
  local_80 = "value";
  local_78 = 0x77;
  local_70 = 7;
  local_68 = "warning";
  local_60 = 0x77;
  local_58 = 8;
  local_50 = "wildcard";
  local_48 = 0x77;
  local_40 = 4;
  local_38 = "word";
  list_00._M_len = 0x27;
  list_00._M_array = &local_3d8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_3e8,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&make_types,&QStack_3e8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_3e8);
  local_3d8.first = 't';
  local_3d8.second.m_size = 4;
  local_3d8.second.m_data = "true";
  local_3c0 = 0x66;
  local_3b8 = 5;
  local_3b0 = "false";
  list_01._M_len = 2;
  list_01._M_array = &local_3d8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_3e8,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&make_literals,&QStack_3e8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_3e8);
  local_3d8.first = '\0';
  local_3d8._1_7_ = 0;
  local_3d8.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&make_builtin,(QMultiHash<char,_QLatin1String> *)&local_3d8);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_3d8);
  local_3d8.first = 'C';
  local_3d8.second.m_size = 6;
  local_3d8.second.m_data = "CFLAGS";
  local_3c0 = 0x4c;
  local_3b8 = 4;
  local_3b0 = "LIBS";
  local_3a8 = 0x50;
  local_3a0 = 6;
  local_398 = "PREFIX";
  list_02._M_len = 3;
  list_02._M_array = &local_3d8;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_3e8,list_02);
  QMultiHash<char,_QLatin1String>::operator=(&make_other,&QStack_3e8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_3e8);
  return;
}

Assistant:

void initMakeData() {
    make_keywords = {
        {'i', QLatin1String("include")},  {'d', QLatin1String("define")},
        {'e', QLatin1String("else")},     {'e', QLatin1String("endef")},
        {'e', QLatin1String("endif")},    {'e', QLatin1String("export")},
        {'i', QLatin1String("ifn?def")},  {'i', QLatin1String("ifn?eq")},
        {'i', QLatin1String("include")},  {'o', QLatin1String("override")},
        {'p', QLatin1String("private")},  {'s', QLatin1String("sinclude")},
        {'u', QLatin1String("undefine")}, {'u', QLatin1String("unexport")},
        {'v', QLatin1String("vpath")}};
    make_types = {
        {'a', QLatin1String("addsuffix")},  {'a', QLatin1String("abspath")},
        {'a', QLatin1String("and")},        {'a', QLatin1String("ar")},
        {'b', QLatin1String("basename")},   {'c', QLatin1String("call")},
        {'d', QLatin1String("dir")},        {'e', QLatin1String("error")},
        {'e', QLatin1String("eval")},       {'f', QLatin1String("file")},
        {'f', QLatin1String("filter")},     {'f', QLatin1String("find")},
        {'f', QLatin1String("findstring")}, {'f', QLatin1String("firstword")},
        {'f', QLatin1String("flavor")},     {'f', QLatin1String("foreach")},
        {'g', QLatin1String("guile")},      {'i', QLatin1String("if")},
        {'i', QLatin1String("info")},       {'i', QLatin1String("install")},
        {'j', QLatin1String("join")},       {'l', QLatin1String("lastword")},
        {'l', QLatin1String("load")},       {'n', QLatin1String("notdir")},
        {'o', QLatin1String("or")},         {'o', QLatin1String("origin")},
        {'p', QLatin1String("patsubst")},   {'r', QLatin1String("ranlib")},
        {'r', QLatin1String("realpath")},   {'r', QLatin1String("rm")},
        {'s', QLatin1String("shell")},      {'s', QLatin1String("sort")},
        {'s', QLatin1String("strip")},      {'s', QLatin1String("subst")},
        {'s', QLatin1String("suffix")},     {'v', QLatin1String("value")},
        {'w', QLatin1String("warning")},    {'w', QLatin1String("wildcard")},
        {'w', QLatin1String("word")}};
    make_literals = {
        {'t', QLatin1String("true")},
        {'f', QLatin1String("false")},
    };
    make_builtin = {};
    make_other = {
        {'C', QLatin1String("CFLAGS")},
        {'L', QLatin1String("LIBS")},
        {'P', QLatin1String("PREFIX")},
    };
}